

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O0

void AI::pruneOldEngramsImpl
               (vector<AI::Engram,_std::allocator<AI::Engram>_> *engrams,int *focus,
               bool maintainOrder)

{
  int iVar1;
  int iVar2;
  int *this;
  bool bVar3;
  size_type sVar4;
  reference pvVar5;
  iterator iVar6;
  iterator iVar7;
  reference piVar8;
  reference __b;
  iterator iStack_a8;
  int id;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  int i_1;
  int oldFocus;
  value_type_conflict2 local_5c;
  int size;
  int i_2;
  vector<int,_std::allocator<int>_> oldIds;
  __normal_iterator<AI::Engram_*,_std::vector<AI::Engram,_std::allocator<AI::Engram>_>_> local_38;
  __normal_iterator<AI::Engram_*,_std::vector<AI::Engram,_std::allocator<AI::Engram>_>_> local_30;
  const_iterator local_28;
  int local_20;
  undefined1 local_19;
  int i;
  bool maintainOrder_local;
  int *focus_local;
  vector<AI::Engram,_std::allocator<AI::Engram>_> *engrams_local;
  
  local_19 = maintainOrder;
  _i = focus;
  focus_local = (int *)engrams;
  if (maintainOrder) {
    for (local_20 = 0; iVar1 = local_20,
        sVar4 = std::vector<AI::Engram,_std::allocator<AI::Engram>_>::size
                          ((vector<AI::Engram,_std::allocator<AI::Engram>_> *)focus_local),
        iVar1 < (int)sVar4; local_20 = local_20 + 1) {
      pvVar5 = std::vector<AI::Engram,_std::allocator<AI::Engram>_>::operator[]
                         ((vector<AI::Engram,_std::allocator<AI::Engram>_> *)focus_local,
                          (long)local_20);
      this = focus_local;
      if (300 < pvVar5->age) {
        local_38._M_current =
             (Engram *)
             std::begin<std::vector<AI::Engram,std::allocator<AI::Engram>>>
                       ((vector<AI::Engram,_std::allocator<AI::Engram>_> *)focus_local);
        local_30 = __gnu_cxx::
                   __normal_iterator<AI::Engram_*,_std::vector<AI::Engram,_std::allocator<AI::Engram>_>_>
                   ::operator+(&local_38,(long)local_20);
        __gnu_cxx::
        __normal_iterator<AI::Engram_const*,std::vector<AI::Engram,std::allocator<AI::Engram>>>::
        __normal_iterator<AI::Engram*>
                  ((__normal_iterator<AI::Engram_const*,std::vector<AI::Engram,std::allocator<AI::Engram>>>
                    *)&local_28,&local_30);
        oldIds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             (pointer)std::vector<AI::Engram,_std::allocator<AI::Engram>_>::erase
                                ((vector<AI::Engram,_std::allocator<AI::Engram>_> *)this,local_28);
        local_20 = local_20 + -1;
      }
    }
  }
  else {
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&size);
    local_5c = 0;
    sVar4 = std::vector<AI::Engram,_std::allocator<AI::Engram>_>::size
                      ((vector<AI::Engram,_std::allocator<AI::Engram>_> *)focus_local);
    for (; local_5c < (int)sVar4; local_5c = local_5c + 1) {
      pvVar5 = std::vector<AI::Engram,_std::allocator<AI::Engram>_>::operator[]
                         ((vector<AI::Engram,_std::allocator<AI::Engram>_> *)focus_local,
                          (long)local_5c);
      if ((300 < pvVar5->age) && (*_i != local_5c)) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)&size,&local_5c);
      }
    }
    iVar6 = std::begin<std::vector<int,std::allocator<int>>>
                      ((vector<int,_std::allocator<int>_> *)&size);
    iVar7 = std::end<std::vector<int,std::allocator<int>>>
                      ((vector<int,_std::allocator<int>_> *)&size);
    std::
    sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::greater<int>>
              (iVar6._M_current,iVar7._M_current);
    iVar1 = *_i;
    __end2 = std::vector<int,_std::allocator<int>_>::begin
                       ((vector<int,_std::allocator<int>_> *)&size);
    iStack_a8 = std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)&size);
    while (bVar3 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff58), bVar3) {
      piVar8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2);
      iVar2 = *piVar8;
      pvVar5 = std::vector<AI::Engram,_std::allocator<AI::Engram>_>::operator[]
                         ((vector<AI::Engram,_std::allocator<AI::Engram>_> *)focus_local,(long)iVar2
                         );
      __b = std::vector<AI::Engram,_std::allocator<AI::Engram>_>::back
                      ((vector<AI::Engram,_std::allocator<AI::Engram>_> *)focus_local);
      std::swap<AI::Engram>(pvVar5,__b);
      std::vector<AI::Engram,_std::allocator<AI::Engram>_>::pop_back
                ((vector<AI::Engram,_std::allocator<AI::Engram>_> *)focus_local);
      if (iVar2 < iVar1) {
        *_i = *_i + -1;
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&size);
  }
  return;
}

Assistant:

void pruneOldEngramsImpl(std::vector<Engram>& engrams, int& focus, bool maintainOrder)
	{
		//A locus' engrams are sensitive to their order, so use a slower method to handle that case
		if (maintainOrder)
		{
			for (int i = 0; i < static_cast<int>(engrams.size()); i++)
			{
				if (engrams[i].age > MaxEngramAge)
				{
					engrams.erase(begin(engrams) + i);
					i--;
				}
			}
		}
		else
		{
			/*
			Order doesn't matter, so we can swap soon-to-be-removed engrams with the
			last engram to do a more efficient pop_back
			*/
			std::vector<int> oldIds;
			for(int i = 0, size = engrams.size(); i < size; i++)
			{
				if (engrams[i].age > MaxEngramAge
					&& focus != i)
				{
					oldIds.push_back(i);
				}
			}

			std::sort(begin(oldIds), end(oldIds), std::greater<int>());

			auto oldFocus = focus;
			int i = 0;
			for(auto id : oldIds)
			{
				std::swap(engrams[id], engrams.back());
				engrams.pop_back();
			
				if (id < oldFocus)
					focus--;

				i++;
			}
		}
		
	}